

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int Reinsert(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int nIdx;
  void *p_00;
  int *aIdx;
  RtreeDValue *aDistance_00;
  RtreeCell *pCell_00;
  long lVar4;
  double local_e8;
  double local_d8;
  double local_d0;
  double local_c8;
  int rc2;
  RtreeCell *p_1;
  RtreeNode *pInsert;
  RtreeCell *p;
  RtreeDValue coord;
  int n;
  int rc;
  int ii;
  int iDim;
  RtreeDValue aCenterCoord [5];
  int nCell;
  RtreeDValue *aDistance;
  RtreeCell *aCell;
  int *aSpare;
  int *aOrder;
  int iHeight_local;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  coord._4_4_ = 0;
  memset(&ii,0,0x28);
  iVar3 = readInt16(pNode->zData + 2);
  nIdx = iVar3 + 1;
  coord._0_4_ = iVar3 + 2U & 0xfffffffe;
  p_00 = sqlite3_malloc64((long)(int)coord._0_4_ << 6);
  if (p_00 == (void *)0x0) {
    pRtree_local._4_4_ = 7;
  }
  else {
    aIdx = (int *)((long)p_00 + (long)(int)coord._0_4_ * 0x30);
    lVar4 = (long)(int)coord._0_4_;
    aDistance_00 = (RtreeDValue *)(aIdx + lVar4 + (int)coord._0_4_);
    for (n = 0; n < nIdx; n = n + 1) {
      if (n == iVar3) {
        memcpy((void *)((long)p_00 + (long)n * 0x30),pCell,0x30);
      }
      else {
        nodeGetCell(pRtree,pNode,n,(RtreeCell *)((long)p_00 + (long)n * 0x30));
      }
      aIdx[n] = n;
      for (rc = 0; rc < (int)(uint)pRtree->nDim; rc = rc + 1) {
        if (pRtree->eCoordType == '\0') {
          local_c8 = (double)*(float *)((long)p_00 + (long)(rc << 1) * 4 + (long)n * 0x30 + 8);
        }
        else {
          local_c8 = (double)*(int *)((long)p_00 + (long)(rc << 1) * 4 + (long)n * 0x30 + 8);
        }
        *(double *)(&ii + (long)rc * 2) = local_c8 + *(double *)(&ii + (long)rc * 2);
        if (pRtree->eCoordType == '\0') {
          local_d0 = (double)*(float *)((long)p_00 + (long)(rc * 2 + 1) * 4 + (long)n * 0x30 + 8);
        }
        else {
          local_d0 = (double)*(int *)((long)p_00 + (long)(rc * 2 + 1) * 4 + (long)n * 0x30 + 8);
        }
        *(double *)(&ii + (long)rc * 2) = local_d0 + *(double *)(&ii + (long)rc * 2);
      }
    }
    for (rc = 0; rc < (int)(uint)pRtree->nDim; rc = rc + 1) {
      *(double *)(&ii + (long)rc * 2) = *(double *)(&ii + (long)rc * 2) / ((double)nIdx * 2.0);
    }
    for (n = 0; n < nIdx; n = n + 1) {
      aDistance_00[n] = 0.0;
      for (rc = 0; rc < (int)(uint)pRtree->nDim; rc = rc + 1) {
        if (pRtree->eCoordType == '\0') {
          local_d8 = (double)*(float *)((long)p_00 + (long)(rc * 2 + 1) * 4 + (long)n * 0x30 + 8);
        }
        else {
          local_d8 = (double)*(int *)((long)p_00 + (long)(rc * 2 + 1) * 4 + (long)n * 0x30 + 8);
        }
        if (pRtree->eCoordType == '\0') {
          local_e8 = (double)*(float *)((long)p_00 + (long)(rc << 1) * 4 + (long)n * 0x30 + 8);
        }
        else {
          local_e8 = (double)*(int *)((long)p_00 + (long)(rc << 1) * 4 + (long)n * 0x30 + 8);
        }
        p = (RtreeCell *)(local_d8 - local_e8);
        aDistance_00[n] =
             ((double)p - *(double *)(&ii + (long)rc * 2)) *
             ((double)p - *(double *)(&ii + (long)rc * 2)) + aDistance_00[n];
      }
    }
    SortByDistance(aIdx,nIdx,aDistance_00,aIdx + lVar4);
    nodeZero(pRtree,pNode);
    n = 0;
    while( true ) {
      bVar1 = false;
      if (coord._4_4_ == 0) {
        uVar2 = (long)(pRtree->iNodeSize + -4) / (long)(int)(uint)pRtree->nBytesPerCell;
        bVar1 = n < nIdx - ((int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 |
                                        uVar2 & 0xffffffff) / 3) + 1);
      }
      if (!bVar1) break;
      pInsert = (RtreeNode *)((long)p_00 + (long)aIdx[n] * 0x30);
      nodeInsertCell(pRtree,pNode,(RtreeCell *)pInsert);
      if (pInsert->pParent == (RtreeNode *)pCell->iRowid) {
        if (iHeight == 0) {
          coord._4_4_ = rowidWrite(pRtree,(sqlite3_int64)pInsert->pParent,pNode->iNode);
        }
        else {
          coord._4_4_ = parentWrite(pRtree,(sqlite3_int64)pInsert->pParent,pNode->iNode);
        }
      }
      n = n + 1;
    }
    if (coord._4_4_ == 0) {
      coord._4_4_ = fixBoundingBox(pRtree,pNode);
    }
    for (; coord._4_4_ == 0 && n < nIdx; n = n + 1) {
      pCell_00 = (RtreeCell *)((long)p_00 + (long)aIdx[n] * 0x30);
      coord._4_4_ = ChooseLeaf(pRtree,pCell_00,iHeight,(RtreeNode **)&p_1);
      if (coord._4_4_ == 0) {
        coord._4_4_ = rtreeInsertCell(pRtree,(RtreeNode *)p_1,pCell_00,iHeight);
        iVar3 = nodeRelease(pRtree,(RtreeNode *)p_1);
        if (coord._4_4_ == 0) {
          coord._4_4_ = iVar3;
        }
      }
    }
    sqlite3_free(p_00);
    pRtree_local._4_4_ = coord._4_4_;
  }
  return pRtree_local._4_4_;
}

Assistant:

static int Reinsert(
  Rtree *pRtree, 
  RtreeNode *pNode, 
  RtreeCell *pCell, 
  int iHeight
){
  int *aOrder;
  int *aSpare;
  RtreeCell *aCell;
  RtreeDValue *aDistance;
  int nCell;
  RtreeDValue aCenterCoord[RTREE_MAX_DIMENSIONS];
  int iDim;
  int ii;
  int rc = SQLITE_OK;
  int n;

  memset(aCenterCoord, 0, sizeof(RtreeDValue)*RTREE_MAX_DIMENSIONS);

  nCell = NCELL(pNode)+1;
  n = (nCell+1)&(~1);

  /* Allocate the buffers used by this operation. The allocation is
  ** relinquished before this function returns.
  */
  aCell = (RtreeCell *)sqlite3_malloc64(n * (
    sizeof(RtreeCell)     +         /* aCell array */
    sizeof(int)           +         /* aOrder array */
    sizeof(int)           +         /* aSpare array */
    sizeof(RtreeDValue)             /* aDistance array */
  ));
  if( !aCell ){
    return SQLITE_NOMEM;
  }
  aOrder    = (int *)&aCell[n];
  aSpare    = (int *)&aOrder[n];
  aDistance = (RtreeDValue *)&aSpare[n];

  for(ii=0; ii<nCell; ii++){
    if( ii==(nCell-1) ){
      memcpy(&aCell[ii], pCell, sizeof(RtreeCell));
    }else{
      nodeGetCell(pRtree, pNode, ii, &aCell[ii]);
    }
    aOrder[ii] = ii;
    for(iDim=0; iDim<pRtree->nDim; iDim++){
      aCenterCoord[iDim] += DCOORD(aCell[ii].aCoord[iDim*2]);
      aCenterCoord[iDim] += DCOORD(aCell[ii].aCoord[iDim*2+1]);
    }
  }
  for(iDim=0; iDim<pRtree->nDim; iDim++){
    aCenterCoord[iDim] = (aCenterCoord[iDim]/(nCell*(RtreeDValue)2));
  }

  for(ii=0; ii<nCell; ii++){
    aDistance[ii] = RTREE_ZERO;
    for(iDim=0; iDim<pRtree->nDim; iDim++){
      RtreeDValue coord = (DCOORD(aCell[ii].aCoord[iDim*2+1]) - 
                               DCOORD(aCell[ii].aCoord[iDim*2]));
      aDistance[ii] += (coord-aCenterCoord[iDim])*(coord-aCenterCoord[iDim]);
    }
  }

  SortByDistance(aOrder, nCell, aDistance, aSpare);
  nodeZero(pRtree, pNode);

  for(ii=0; rc==SQLITE_OK && ii<(nCell-(RTREE_MINCELLS(pRtree)+1)); ii++){
    RtreeCell *p = &aCell[aOrder[ii]];
    nodeInsertCell(pRtree, pNode, p);
    if( p->iRowid==pCell->iRowid ){
      if( iHeight==0 ){
        rc = rowidWrite(pRtree, p->iRowid, pNode->iNode);
      }else{
        rc = parentWrite(pRtree, p->iRowid, pNode->iNode);
      }
    }
  }
  if( rc==SQLITE_OK ){
    rc = fixBoundingBox(pRtree, pNode);
  }
  for(; rc==SQLITE_OK && ii<nCell; ii++){
    /* Find a node to store this cell in. pNode->iNode currently contains
    ** the height of the sub-tree headed by the cell.
    */
    RtreeNode *pInsert;
    RtreeCell *p = &aCell[aOrder[ii]];
    rc = ChooseLeaf(pRtree, p, iHeight, &pInsert);
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pInsert, p, iHeight);
      rc2 = nodeRelease(pRtree, pInsert);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
  }

  sqlite3_free(aCell);
  return rc;
}